

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

string * __thiscall
RigidBodyDynamics::Utils::GetModelDOFOverview_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model)

{
  string *psVar1;
  ostream *poVar2;
  long lVar3;
  SpatialVector *joint_dof;
  SpatialVector *joint_dof_00;
  long extraout_RDX;
  uint j;
  ulong uVar4;
  Model *model_00;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  string local_208;
  string *local_1e8;
  ulong local_1e0;
  string local_1d8;
  stringstream result;
  undefined1 local_1a8 [376];
  
  local_1e8 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"",(allocator<char> *)&local_1d8);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&result,(string *)&local_208,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&local_208);
  uVar7 = 0;
  model_00 = (Model *)0x1;
  while( true ) {
    psVar1 = local_1e8;
    lVar3 = (*(long *)(this + 0x340) - *(long *)(this + 0x338)) % 0x70;
    if ((Model *)((*(long *)(this + 0x340) - *(long *)(this + 0x338)) / 0x70) <= model_00) break;
    lVar8 = (long)model_00 * 0x18;
    uVar6 = *(uint *)(*(long *)(this + 0xa0) + 0xc + lVar8);
    if (uVar6 == 1) {
      poVar2 = std::operator<<(local_1a8,0x20,lVar3);
      lVar3 = *(long *)(*(long *)poVar2 + -0x18);
      *(undefined8 *)(poVar2 + lVar3 + 0x10) = 3;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      uVar6 = (uint)lVar3;
      poVar2 = std::operator<<(poVar2,": ");
      get_body_name_abi_cxx11_(&local_208,this,model_00,uVar6);
      poVar2 = std::operator<<(poVar2,(string *)&local_208);
      poVar2 = std::operator<<(poVar2,"_");
      get_dof_name_abi_cxx11_
                (&local_1d8,(Utils *)((long)model_00 * 0x30 + *(long *)(this + 0xb8)),joint_dof);
      poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_208);
      uVar6 = (int)uVar7 + 1;
    }
    else {
      lVar5 = 0;
      local_1e0 = uVar7;
      for (uVar4 = 0; uVar4 < uVar6; uVar4 = uVar4 + 1) {
        poVar2 = std::operator<<(local_1a8,0x20,lVar3);
        uVar6 = (int)uVar7 + (int)uVar4;
        *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 3;
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        poVar2 = std::operator<<(poVar2,": ");
        get_body_name_abi_cxx11_(&local_208,this,model_00,uVar6);
        poVar2 = std::operator<<(poVar2,(string *)&local_208);
        poVar2 = std::operator<<(poVar2,"_");
        get_dof_name_abi_cxx11_
                  (&local_1d8,(Utils *)(*(long *)(*(long *)(this + 0xa0) + lVar8) + lVar5),
                   joint_dof_00);
        poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_208);
        uVar6 = *(uint *)(*(long *)(this + 0xa0) + 0xc + lVar8);
        lVar5 = lVar5 + 0x30;
        lVar3 = extraout_RDX;
      }
      uVar6 = (int)local_1e0 + (int)uVar4;
    }
    uVar7 = (ulong)uVar6;
    model_00 = (Model *)(ulong)((int)model_00 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result);
  return psVar1;
}

Assistant:

RBDL_DLLAPI std::string GetModelDOFOverview (const Model &model) {
  stringstream result ("");

  unsigned int q_index = 0;
  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    if (model.mJoints[i].mDoFCount == 1) {
      result << setfill(' ') << setw(3) << q_index << ": " << get_body_name(model,
             i) << "_" << get_dof_name (model.S[i]) << endl;
      q_index++;
    } else {
      for (unsigned int j = 0; j < model.mJoints[i].mDoFCount; j++) {
        result << setfill(' ') << setw(3) << q_index << ": " << get_body_name(model,
               i) << "_" << get_dof_name (model.mJoints[i].mJointAxes[j]) << endl;
        q_index++;
      }
    }
  }

  return result.str();
}